

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O1

void __thiscall MinVR::VRError::~VRError(VRError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__VRError_001291a0;
  pcVar2 = (this->_whereLine)._M_dataplus._M_p;
  paVar1 = &(this->_whereLine).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_whereFunc)._M_dataplus._M_p;
  paVar1 = &(this->_whereFunc).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_whereFile)._M_dataplus._M_p;
  paVar1 = &(this->_whereFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_adviceMsg)._M_dataplus._M_p;
  paVar1 = &(this->_adviceMsg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_whatMsg)._M_dataplus._M_p;
  paVar1 = &(this->_whatMsg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~VRError() throw (){}